

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

civil_lookup *
absl::lts_20250127::time_internal::cctz::anon_unknown_0::MakeSkipped
          (civil_lookup *__return_storage_ptr__,Transition *tr,civil_second *cs)

{
  undefined8 uVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  diff_t dVar6;
  
  __return_storage_ptr__->kind = SKIPPED;
  uVar1._0_1_ = (cs->f_).m;
  uVar1._1_1_ = (cs->f_).d;
  uVar1._2_1_ = (cs->f_).hh;
  uVar1._3_1_ = (cs->f_).mm;
  uVar1._4_1_ = (cs->f_).ss;
  uVar1._5_3_ = *(undefined3 *)&(cs->f_).field_0xd;
  lVar2 = tr->unix_time;
  uVar3._0_1_ = (tr->prev_civil_sec).f_.m;
  uVar3._1_1_ = (tr->prev_civil_sec).f_.d;
  uVar3._2_1_ = (tr->prev_civil_sec).f_.hh;
  uVar3._3_1_ = (tr->prev_civil_sec).f_.mm;
  uVar3._4_1_ = (tr->prev_civil_sec).f_.ss;
  uVar3._5_3_ = *(undefined3 *)&(tr->prev_civil_sec).f_.field_0xd;
  dVar6 = detail::difference((detail *)(cs->f_).y,uVar1,(tr->prev_civil_sec).f_.y,uVar3);
  (__return_storage_ptr__->pre).__d.__r = dVar6 + lVar2 + -1;
  lVar2 = tr->unix_time;
  (__return_storage_ptr__->trans).__d.__r = lVar2;
  uVar4._0_1_ = (tr->civil_sec).f_.m;
  uVar4._1_1_ = (tr->civil_sec).f_.d;
  uVar4._2_1_ = (tr->civil_sec).f_.hh;
  uVar4._3_1_ = (tr->civil_sec).f_.mm;
  uVar4._4_1_ = (tr->civil_sec).f_.ss;
  uVar4._5_3_ = *(undefined3 *)&(tr->civil_sec).f_.field_0xd;
  uVar5._0_1_ = (cs->f_).m;
  uVar5._1_1_ = (cs->f_).d;
  uVar5._2_1_ = (cs->f_).hh;
  uVar5._3_1_ = (cs->f_).mm;
  uVar5._4_1_ = (cs->f_).ss;
  uVar5._5_3_ = *(undefined3 *)&(cs->f_).field_0xd;
  dVar6 = detail::difference((detail *)(tr->civil_sec).f_.y,uVar4,(cs->f_).y,uVar5);
  (__return_storage_ptr__->post).__d.__r = lVar2 - dVar6;
  return __return_storage_ptr__;
}

Assistant:

inline time_zone::civil_lookup MakeSkipped(const Transition& tr,
                                           const civil_second& cs) {
  time_zone::civil_lookup cl;
  cl.kind = time_zone::civil_lookup::SKIPPED;
  cl.pre = FromUnixSeconds(tr.unix_time - 1 + (cs - tr.prev_civil_sec));
  cl.trans = FromUnixSeconds(tr.unix_time);
  cl.post = FromUnixSeconds(tr.unix_time - (tr.civil_sec - cs));
  return cl;
}